

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

rtr_signature_seg * rtr_bgpsec_pop_signature_seg(rtr_bgpsec *bgpsec)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_signature_seg *tmp;
  rtr_bgpsec *bgpsec_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bgpsec->sigs == (rtr_signature_seg *)0x0) {
    bgpsec_local = (rtr_bgpsec *)0x0;
  }
  else {
    bgpsec_local = (rtr_bgpsec *)bgpsec->sigs;
    bgpsec->sigs = bgpsec->sigs->next;
    bgpsec->sigs_len = bgpsec->sigs_len - 1;
    bgpsec_local->alg = '\0';
    bgpsec_local->safi = '\0';
    bgpsec_local->afi = 0;
    bgpsec_local->my_as = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (rtr_signature_seg *)bgpsec_local;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_signature_seg *rtr_bgpsec_pop_signature_seg(struct rtr_bgpsec *bgpsec)
{
	struct rtr_signature_seg *tmp = NULL;

	if (!bgpsec->sigs)
		return NULL;

	tmp = bgpsec->sigs;
	bgpsec->sigs = bgpsec->sigs->next;
	bgpsec->sigs_len--;
	tmp->next = NULL;
	return tmp;
}